

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

void clusterDDel(vector<DirectDelNode,_std::allocator<DirectDelNode>_> *nodes,
                vector<DirectDelCluster,_std::allocator<DirectDelCluster>_> *clusters)

{
  bool bVar1;
  bool bVar2;
  reference pDVar3;
  size_type sVar4;
  reference pvVar5;
  DirectDelNode local_d8;
  undefined1 local_b0 [8];
  DirectDelCluster dc;
  int local_60;
  int i;
  bool found;
  DirectDelNode n;
  const_iterator __end1;
  const_iterator __begin1;
  vector<DirectDelNode,_std::allocator<DirectDelNode>_> *__range1;
  vector<DirectDelCluster,_std::allocator<DirectDelCluster>_> *clusters_local;
  vector<DirectDelNode,_std::allocator<DirectDelNode>_> *nodes_local;
  
  __end1 = std::vector<DirectDelNode,_std::allocator<DirectDelNode>_>::begin(nodes);
  n.refName.field_2._8_8_ = std::vector<DirectDelNode,_std::allocator<DirectDelNode>_>::end(nodes);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_DirectDelNode_*,_std::vector<DirectDelNode,_std::allocator<DirectDelNode>_>_>
                                *)((long)&n.refName.field_2 + 8));
    if (!bVar1) {
      return;
    }
    pDVar3 = __gnu_cxx::
             __normal_iterator<const_DirectDelNode_*,_std::vector<DirectDelNode,_std::allocator<DirectDelNode>_>_>
             ::operator*(&__end1);
    DirectDelNode::DirectDelNode((DirectDelNode *)&i,pDVar3);
    bVar1 = false;
    sVar4 = std::vector<DirectDelCluster,_std::allocator<DirectDelCluster>_>::size(clusters);
    local_60 = (int)sVar4;
    do {
      local_60 = local_60 + -1;
      if (local_60 < 0) goto LAB_00270a14;
      pvVar5 = std::vector<DirectDelCluster,_std::allocator<DirectDelCluster>_>::at
                         (clusters,(long)local_60);
      bVar2 = std::operator!=(&(pvVar5->info).refName,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &n);
      if (bVar2) goto LAB_00270a14;
      pvVar5 = std::vector<DirectDelCluster,_std::allocator<DirectDelCluster>_>::at
                         (clusters,(long)local_60);
      bVar2 = checkRO(&pvVar5->info,(DirectDelNode *)&i);
    } while (!bVar2);
    pvVar5 = std::vector<DirectDelCluster,_std::allocator<DirectDelCluster>_>::at
                       (clusters,(long)local_60);
    std::vector<DirectDelNode,std::allocator<DirectDelNode>>::emplace_back<DirectDelNode&>
              ((vector<DirectDelNode,std::allocator<DirectDelNode>> *)&pvVar5->nodes,
               (DirectDelNode *)&i);
    bVar1 = true;
LAB_00270a14:
    if (!bVar1) {
      DirectDelNode::DirectDelNode(&local_d8,(DirectDelNode *)&i);
      DirectDelCluster::DirectDelCluster((DirectDelCluster *)local_b0,&local_d8);
      DirectDelNode::~DirectDelNode(&local_d8);
      std::vector<DirectDelCluster,std::allocator<DirectDelCluster>>::
      emplace_back<DirectDelCluster&>
                ((vector<DirectDelCluster,std::allocator<DirectDelCluster>> *)clusters,
                 (DirectDelCluster *)local_b0);
      DirectDelCluster::~DirectDelCluster((DirectDelCluster *)local_b0);
    }
    DirectDelNode::~DirectDelNode((DirectDelNode *)&i);
    __gnu_cxx::
    __normal_iterator<const_DirectDelNode_*,_std::vector<DirectDelNode,_std::allocator<DirectDelNode>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void clusterDDel(const std::vector<DirectDelNode> &nodes, std::vector<DirectDelCluster> &clusters)
{
	for (DirectDelNode n : nodes)
	{
		bool found = false;
		for (int i = clusters.size() - 1; i >= 0; i--)
		{
			// diff chr
			if (clusters.at(i).info.refName != n.refName)
				break;
			if (checkRO(clusters.at(i).info, n))
			{
				// push new node
				clusters.at(i).nodes.emplace_back(n);
				found = true;
				break;
			}
		}
		// add new cluster
		if (!found)
		{
			DirectDelCluster dc(n);
			clusters.emplace_back(dc);
		}
	}
}